

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSelector.cpp
# Opt level: O3

int __thiscall
Kernel::LiteralSelector::select
          (LiteralSelector *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds
          ,timeval *__timeout)

{
  Literal *pLVar1;
  int extraout_EAX;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 in_register_00000034;
  Clause *this_00;
  bool bVar8;
  Literal *__tmp;
  int iVar9;
  
  this_00 = (Clause *)CONCAT44(in_register_00000034,__nfds);
  if ((int)__readfds == 0) {
    __readfds = (fd_set *)(ulong)(*(uint *)&this_00->field_0x38 & 0xfffff);
  }
  uVar6 = (uint)__readfds;
  if (1 < uVar6) {
    uVar4 = 1;
    bVar8 = false;
    iVar2 = (uint)((*(ushort *)
                     (*(long *)(*(long *)(DAT_00b521b0 + 0x80) +
                               (ulong)(this_00->_literals[0]->super_Term)._functor * 8) + 0x40) &
                   0x420) == 0) * 2 + -2;
LAB_00548f0b:
    uVar7 = 1;
    uVar5 = uVar4;
    do {
      uVar4 = uVar5 + 1;
      pLVar1 = this_00->_literals[(int)uVar5];
      iVar9 = (uint)((*(ushort *)
                       (*(long *)(*(long *)(DAT_00b521b0 + 0x80) +
                                 (ulong)(pLVar1->super_Term)._functor * 8) + 0x40) & 0x420) == 0) *
              2 + -2;
      if (iVar9 == iVar2) {
        if (uVar5 != uVar7) {
          this_00->_literals[(int)uVar5] = this_00->_literals[(int)uVar7];
          this_00->_literals[(int)uVar7] = pLVar1;
          bVar8 = true;
        }
        uVar7 = uVar7 + 1;
      }
      else if (iVar2 < iVar9) goto LAB_00548f82;
      uVar5 = uVar4;
      if (uVar4 == uVar6) {
        if (bVar8) goto LAB_00548fae;
        goto LAB_00548fb6;
      }
    } while( true );
  }
  uVar3 = *(ulong *)&this_00->field_0x38 & 0xfff00000ffffffff | (long)__readfds << 0x20;
LAB_00548fce:
  *(ulong *)&this_00->field_0x38 = uVar3;
  Clause::notifyLiteralReorder(this_00);
  return extraout_EAX;
LAB_00548f82:
  this_00->_literals[(int)uVar5] = this_00->_literals[0];
  this_00->_literals[0] = pLVar1;
  bVar8 = true;
  iVar2 = iVar9;
  if (uVar4 == uVar6) goto code_r0x00548fa1;
  goto LAB_00548f0b;
code_r0x00548fa1:
  uVar7 = 1;
LAB_00548fae:
  Clause::notifyLiteralReorder(this_00);
LAB_00548fb6:
  if (uVar7 != 1) {
    iVar2 = (*this->_vptr_LiteralSelector[4])(this,this_00,(ulong)uVar7);
    return iVar2;
  }
  uVar3 = *(ulong *)&this_00->field_0x38 & 0xfff00000ffffffff | 0x100000000;
  goto LAB_00548fce;
}

Assistant:

void LiteralSelector::select(Clause* c, unsigned eligibleInp)
{
  ASS_LE(eligibleInp, c->length());

  if(eligibleInp==0) {
    eligibleInp = c->length();
  }

  if(eligibleInp<=1) {
    c->setSelected(eligibleInp);
    return;
  }

  unsigned eligible=1;
  { /* we order the clause so that the literals with highest `getSelectionPriority` are in the front, and eligible is the number of literals with that selection priority */ 
    int maxPriority=getSelectionPriority((*c)[0]);
    bool modified=false;

    for (unsigned i = 1; i < eligibleInp; i++) {
      int priority = getSelectionPriority((*c)[i]);
      if (priority == maxPriority) {
        if (eligible != i) {
          swap((*c)[i], (*c)[eligible]);
          modified = true;
        }
        eligible++;
      } else if (priority > maxPriority) {
        maxPriority = priority;
        eligible = 1;
        swap((*c)[i], (*c)[0]);
        modified = true;
      }
    }
    ASS_LE(eligible,eligibleInp);
    if(modified) {
      c->notifyLiteralReorder();
    }
  }

  if(eligible==1) {
    c->setSelected(eligible);
    return;
  }

  ASS_G(eligible,1);
  doSelection(c, eligible);
}